

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O2

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::getLeftmost(Earcut<unsigned_int> *this,Node *start)

{
  double dVar1;
  double dVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *p;
  
  pNVar3 = start;
  pNVar4 = start;
  do {
    dVar1 = pNVar4->x;
    dVar2 = pNVar3->x;
    if ((dVar1 < dVar2) ||
       (((dVar1 == dVar2 && (!NAN(dVar1) && !NAN(dVar2))) &&
        (pNVar4->y <= pNVar3->y && pNVar3->y != pNVar4->y)))) {
      pNVar3 = pNVar4;
    }
    pNVar4 = pNVar4->next;
  } while (pNVar4 != start);
  return pNVar3;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::getLeftmost(Node* start) {
    Node* p = start;
    Node* leftmost = start;
    do {
        if (p->x < leftmost->x || (p->x == leftmost->x && p->y < leftmost->y))
            leftmost = p;
        p = p->next;
    } while (p != start);

    return leftmost;
}